

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void I422ToARGBRow_C(uint8 *src_y,uint8 *src_u,uint8 *src_v,uint8 *rgb_buf,
                    YuvConstants *yuvconstants,int width)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  for (iVar1 = 0; iVar1 < width + -1; iVar1 = iVar1 + 2) {
    libyuv::YuvPixel(src_y[lVar2 * 2],src_u[lVar2],src_v[lVar2],rgb_buf,rgb_buf + 1,rgb_buf + 2,
                     yuvconstants);
    rgb_buf[3] = 0xff;
    libyuv::YuvPixel(src_y[lVar2 * 2 + 1],src_u[lVar2],src_v[lVar2],rgb_buf + 4,rgb_buf + 5,
                     rgb_buf + 6,yuvconstants);
    rgb_buf[7] = 0xff;
    rgb_buf = rgb_buf + 8;
    lVar2 = lVar2 + 1;
  }
  if ((width & 1U) != 0) {
    libyuv::YuvPixel(src_y[lVar2 * 2],src_u[lVar2],src_v[lVar2],rgb_buf,rgb_buf + 1,rgb_buf + 2,
                     yuvconstants);
    rgb_buf[3] = 0xff;
  }
  return;
}

Assistant:

void I422ToARGBRow_C(const uint8* src_y,
                     const uint8* src_u,
                     const uint8* src_v,
                     uint8* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
    YuvPixel(src_y[1], src_u[0], src_v[0], rgb_buf + 4, rgb_buf + 5,
             rgb_buf + 6, yuvconstants);
    rgb_buf[7] = 255;
    src_y += 2;
    src_u += 1;
    src_v += 1;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
  }
}